

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O0

void __thiscall RoughConductorBRDF::sample_f(RoughConductorBRDF *this)

{
  Sampler *in_stack_000000c8;
  float *in_stack_000000d0;
  vec3f *in_stack_000000d8;
  vec3f *in_stack_000000e0;
  Color *in_stack_000000e8;
  RoughConductorBRDF *in_stack_000000f0;
  
  sample_f(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0
           ,in_stack_000000c8);
  return;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		vec2f u = sampler.get2f();
    	vec3f wm = schuttejoe::GgxVndf(wo, alpha, u.x, u.y);
		wi = 2*dot(wm,wo)*wm-wo;
		// http://jcgt.org/published/0007/04/01/paper.pdf Eric Heitz
		pdf = EDX::Smith_G1(wi, wm, alpha) * EDX::GGX_D(wm,alpha) * fabs(dot(wo,wm)) / (4 * fabs(dot(wi, wm)) * fabs(wo.z));
    	if (wi.z<0 ^ wo.z<0) return 0;
    	return f(albedo, wo, wi);
	}